

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_symbol_codec.cpp
# Opt level: O0

uint __thiscall crnlib::symbol_codec::decode_golomb(symbol_codec *this,uint m)

{
  uint uVar1;
  uint r;
  uint l;
  uint k;
  uint q;
  uint m_local;
  symbol_codec *this_local;
  
  l = 0;
  do {
    uVar1 = decode_peek_bits(this,0x10);
    uVar1 = utils::count_leading_zeros16((uVar1 ^ 0xffffffff) & 0xffff);
    l = uVar1 + l;
  } while (0xf < uVar1);
  decode_remove_bits(this,l + 1);
  uVar1 = decode_truncated_binary(this,m);
  return l * m + uVar1;
}

Assistant:

uint symbol_codec::decode_golomb(uint m) {
  CRNLIB_ASSERT(m > 1);

  uint q = 0;

  for (;;) {
    uint k = decode_peek_bits(16);

    uint l = utils::count_leading_zeros16((~k) & 0xFFFF);
    q += l;
    if (l < 16)
      break;
  }

  decode_remove_bits(q + 1);

  uint r = decode_truncated_binary(m);

  return (q * m) + r;
}